

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::Subst_Backward
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this,
          TPZFMatrix<float> *b)

{
  undefined8 in_RSI;
  TPZFMatrix<float> *in_RDI;
  TPZStackEqnStorage<float> *unaff_retaddr;
  DecomposeType dec;
  DecomposeType dec_00;
  TPZFMatrix<float> *f;
  
  dec_00 = (DecomposeType)((ulong)in_RSI >> 0x20);
  f = in_RDI;
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFront<float>::GetDecomposeType((TPZFront<float> *)in_RDI[0x26d].fPivot.fExtAlloc);
  TPZStackEqnStorage<float>::Backward(unaff_retaddr,f,dec_00);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}